

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

void __thiscall Image::_drawList(Image *this)

{
  float local_a8;
  float local_a4;
  float verts [18];
  undefined8 uStack_58;
  float texCoords [12];
  
  (*glad_glEnable)(0xde1);
  (*glad_glBindTexture)(0xde1,this->texture->id);
  local_a8 = this->x;
  verts[5] = this->y;
  local_a4 = verts[5] - this->height;
  verts[0] = this->z;
  verts[1] = this->width + local_a8;
  uStack_58 = 0;
  texCoords[4] = 0.0;
  texCoords[5] = 0.0;
  texCoords[0] = 1.0;
  texCoords[1] = 0.0;
  texCoords[2] = 1.0;
  texCoords[3] = 1.0;
  texCoords[6] = 1.0;
  texCoords[7] = 1.0;
  texCoords[8] = 0.0;
  texCoords[9] = 1.0;
  verts[2] = local_a4;
  verts[3] = verts[0];
  verts[4] = verts[1];
  verts[6] = verts[0];
  verts[7] = local_a8;
  verts[8] = local_a4;
  verts[9] = verts[0];
  verts[10] = verts[1];
  verts[0xb] = verts[5];
  verts[0xc] = verts[0];
  verts[0xd] = local_a8;
  verts[0xe] = verts[5];
  verts[0xf] = verts[0];
  (*glad_glEnableClientState)(0x8074);
  (*glad_glEnableClientState)(0x8078);
  (*glad_glVertexPointer)(3,0x1406,0,&local_a8);
  (*glad_glTexCoordPointer)(2,0x1406,0,&uStack_58);
  (*glad_glDrawArrays)(4,0,6);
  (*glad_glDisableClientState)(0x8074);
  (*glad_glDisableClientState)(0x8078);
  (*glad_glDisable)(0xde1);
  return;
}

Assistant:

void Image::_drawList() {
    // Enable texture
    glEnable(GL_TEXTURE_2D);
    glBindTexture(GL_TEXTURE_2D, texture->id);

    // Define the vertex arrays 
    float verts[] = { x,         y - height, z,   // Bottom Left
                      x + width, y - height, z,   // Bottom Right
                      x + width, y,          z,   // Top Right

                      x,         y - height, z,   // Bottom Left
                      x + width, y,          z,   // Top Right
                      x,         y,          z }; // Top Left

    // TODO: Figure out why it seems like tex coords are flipped vertically compared to vert coords...
    float texCoords[] = { 0, 0,   // Bottom Left
                          1, 0,   // Bottom Right
                          1, 1,   // Top Right

                          0, 0,   // Bottom Left
                          1, 1,   // Top Right 
                          0, 1 }; // Top Left

    // Enable vertex and texture array drawing modes
    glEnableClientState(GL_VERTEX_ARRAY);
    glEnableClientState(GL_TEXTURE_COORD_ARRAY);

    // Specify the arrays to use
    glVertexPointer(3, GL_FLOAT, 0, verts);
    glTexCoordPointer(2, GL_FLOAT, 0, texCoords);

    // Draw the quad
    glDrawArrays(GL_TRIANGLES, 0, 6);

    // Disable vertex and texture array drawing modes
    glDisableClientState(GL_VERTEX_ARRAY);
    glDisableClientState(GL_TEXTURE_COORD_ARRAY);

    glDisable(GL_TEXTURE_2D);
}